

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall
ViconCGStreamIO::VBuffer::Write<unsigned_int,unsigned_int>
          (VBuffer *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *i_rValues)

{
  _Rb_tree_node_base *p_Var1;
  uint local_1c;
  
  local_1c = (uint)(i_rValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  VBufferImpl::WritePod<unsigned_int>(&this->m_BufferImpl,&local_1c);
  for (p_Var1 = (i_rValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(i_rValues->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    VBufferImpl::WritePod<unsigned_int>(&this->m_BufferImpl,&p_Var1[1]._M_color);
    VBufferImpl::WritePod<unsigned_int>(&this->m_BufferImpl,(uint *)&p_Var1[1].field_0x4);
  }
  return;
}

Assistant:

void Write( const std::map< K, V > & i_rValues )
  {
    m_BufferImpl.WritePod< ViconCGStreamType::UInt32 >( static_cast< ViconCGStreamType::UInt32 >( i_rValues.size() ) );
    
    typename std::map< K, V >::const_iterator It = i_rValues.begin();
    typename std::map< K, V >::const_iterator End = i_rValues.end();
    for( ; It != End; ++It )
    {
      Write( ( *It ).first );
      Write( ( *It ).second );
    }
  }